

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Array<unsigned_char> * __thiscall
kj::anon_unknown_36::WebSocketImpl::serializeClose
          (Array<unsigned_char> *__return_storage_ptr__,WebSocketImpl *this,uint16_t code,
          StringPtr reason)

{
  char *__n;
  undefined6 in_register_00000012;
  char *count;
  Array<unsigned_char> payload;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  
  payload.disposer = (ArrayDisposer *)0x0;
  payload.ptr = (uchar *)0x0;
  payload.size_ = 0;
  __n = reason.content.ptr + -1;
  if ((int)this == 0x3ed) {
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = __n == (char *)0x0;
    if (!_kjCondition.result) {
      _kjCondition.left = (unsigned_long)__n;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[47]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xe14,FAILED,"reason.size() == 0",
                 "_kjCondition,\"WebSocket close code 1005 cannot have a reason\"",&_kjCondition,
                 (char (*) [47])"WebSocket close code 1005 cannot have a reason");
      kj::_::Debug::Fault::fatal(&f);
    }
    payload.size_ = 0;
    payload.ptr = (uchar *)0x0;
    _kjCondition.left = 0;
  }
  else {
    count = reason.content.ptr + 1;
    _kjCondition.left =
         (unsigned_long)kj::_::HeapArrayDisposer::allocate<unsigned_char>((size_t)count);
    _kjCondition.op.content.ptr = (char *)&kj::_::HeapArrayDisposer::instance;
    _kjCondition._8_8_ = count;
    Array<unsigned_char>::operator=(&payload,(Array<unsigned_char> *)&_kjCondition);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&_kjCondition);
    *payload.ptr = (uchar)(((ulong)this & 0xffffffff) >> 8);
    payload.ptr[1] = (uchar)((ulong)this & 0xffffffff);
    memcpy(payload.ptr + 2,(void *)CONCAT62(in_register_00000012,code),(size_t)__n);
  }
  __return_storage_ptr__->ptr = payload.ptr;
  __return_storage_ptr__->size_ = payload.size_;
  __return_storage_ptr__->disposer = payload.disposer;
  payload.ptr = (uchar *)0x0;
  payload.size_ = 0;
  Array<unsigned_char>::~Array(&payload);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<byte> serializeClose(uint16_t code, kj::StringPtr reason) {
    kj::Array<byte> payload;
    if (code == 1005) {
      KJ_REQUIRE(reason.size() == 0, "WebSocket close code 1005 cannot have a reason");

      // code 1005 -- leave payload empty
    } else {
      payload = heapArray<byte>(reason.size() + 2);
      payload[0] = code >> 8;
      payload[1] = code;
      memcpy(payload.begin() + 2, reason.begin(), reason.size());
    }
    return kj::mv(payload);
  }